

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O1

void duckdb::TemplatedConstructSortKey<duckdb::SortKeyConstantOperator<signed_char>>
               (SortKeyVectorData *vector_data,SortKeyChunk chunk,SortKeyConstructInfo *info)

{
  data_t dVar1;
  data_ptr_t pdVar2;
  unsafe_vector<idx_t> *puVar3;
  sel_t *psVar4;
  pointer puVar5;
  data_ptr_t pdVar6;
  unsigned_long *puVar7;
  ulong uVar8;
  ulong uVar9;
  unsigned_long uVar10;
  ulong in_stack_00000008;
  ulong in_stack_00000010;
  ulong in_stack_00000018;
  char in_stack_00000020;
  
  if (in_stack_00000008 < in_stack_00000010) {
    pdVar2 = (vector_data->format).data;
    puVar3 = info->offsets;
    do {
      uVar8 = in_stack_00000008;
      if (in_stack_00000020 != '\0') {
        uVar8 = in_stack_00000018;
      }
      psVar4 = ((vector_data->format).sel)->sel_vector;
      uVar9 = in_stack_00000008;
      if (psVar4 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar4[in_stack_00000008];
      }
      puVar5 = (puVar3->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = info->result_data[uVar8];
      puVar7 = (vector_data->format).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      if ((puVar7 == (unsigned_long *)0x0) || ((puVar7[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0)) {
        dVar1 = vector_data->valid_byte;
        uVar10 = puVar5[uVar8];
        puVar5[uVar8] = uVar10 + 1;
        pdVar6[uVar10] = dVar1;
        pdVar6[puVar5[uVar8]] = pdVar2[uVar9] + 0x80;
        if ((info->flip_bytes == true) && (uVar10 = puVar5[uVar8], uVar10 != 0xffffffffffffffff)) {
          do {
            pdVar6[uVar10] = ~pdVar6[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar10 < puVar5[uVar8] + 1);
        }
        puVar5[uVar8] = puVar5[uVar8] + 1;
      }
      else {
        dVar1 = vector_data->null_byte;
        uVar10 = puVar5[uVar8];
        puVar5[uVar8] = uVar10 + 1;
        pdVar6[uVar10] = dVar1;
      }
      in_stack_00000008 = in_stack_00000008 + 1;
    } while (in_stack_00000008 != in_stack_00000010);
  }
  return;
}

Assistant:

void TemplatedConstructSortKey(SortKeyVectorData &vector_data, SortKeyChunk chunk, SortKeyConstructInfo &info) {
	auto data = UnifiedVectorFormat::GetData<typename OP::TYPE>(vector_data.format);
	auto &offsets = info.offsets;
	for (idx_t r = chunk.start; r < chunk.end; r++) {
		auto result_index = chunk.GetResultIndex(r);
		auto idx = vector_data.format.sel->get_index(r);
		auto &offset = offsets[result_index];
		auto result_ptr = info.result_data[result_index];
		if (!vector_data.format.validity.RowIsValid(idx)) {
			// NULL value - write the null byte and skip
			result_ptr[offset++] = vector_data.null_byte;
			continue;
		}
		// valid value - write the validity byte
		result_ptr[offset++] = vector_data.valid_byte;
		idx_t encode_len = OP::Encode(result_ptr + offset, data[idx]);
		if (info.flip_bytes) {
			// descending order - so flip bytes
			for (idx_t b = offset; b < offset + encode_len; b++) {
				result_ptr[b] = ~result_ptr[b];
			}
		}
		offset += encode_len;
	}
}